

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O2

file_or_directory * __thiscall
cmrc::embedded_filesystem::_get(embedded_filesystem *this,string *path)

{
  const_iterator cVar1;
  file_or_directory *pfVar2;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&sStack_58,(string *)path);
  detail::normalize_path(&local_38,&sStack_58);
  std::__cxx11::string::operator=((string *)path,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
          ::find(&this->_index->_M_t,path);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->_index->_M_t)._M_impl.super__Rb_tree_header) {
    pfVar2 = (file_or_directory *)0x0;
  }
  else {
    pfVar2 = *(file_or_directory **)(cVar1._M_node + 2);
  }
  return pfVar2;
}

Assistant:

const detail::file_or_directory* _get(std::string path) const {
        path = detail::normalize_path(path);
        auto found = _index->find(path);
        if (found == _index->end()) {
            return nullptr;
        } else {
            return found->second;
        }
    }